

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

float calculateEdginess(Mat *inputImg)

{
  int iVar1;
  int iVar2;
  _InputArray *p_Var3;
  long lVar4;
  ulong uVar5;
  float fVar6;
  float fVar7;
  Mat grad;
  Mat abs_grad_y;
  Mat abs_grad_x;
  Mat grad_y;
  Mat grad_x;
  _InputArray local_250;
  _OutputArray local_238;
  _InputArray local_220;
  _InputArray local_208 [3];
  long *local_1c0;
  Mat local_1a8 [96];
  Mat local_148 [96];
  Mat local_e8 [96];
  Mat local_88 [96];
  
  cv::Mat::Mat(local_88);
  cv::Mat::Mat(local_e8);
  cv::Mat::Mat(local_148);
  cv::Mat::Mat(local_1a8);
  local_208[0].sz.width = 0;
  local_208[0].sz.height = 0;
  local_208[0].flags = 0x1010000;
  local_250.sz.width = 0;
  local_250.sz.height = 0;
  local_250.flags = 0x2010000;
  local_250.obj = local_88;
  local_208[0].obj = inputImg;
  cv::Sobel(local_208,(_OutputArray *)&local_250,0,1,0,3,1.0,0.0,4);
  local_208[0].sz.width = 0;
  local_208[0].sz.height = 0;
  local_208[0].flags = 0x1010000;
  local_250.sz.width = 0;
  local_250.sz.height = 0;
  local_250.flags = 0x2010000;
  local_250.obj = local_148;
  local_208[0].obj = local_88;
  cv::convertScaleAbs(local_208,(_OutputArray *)&local_250,1.0,0.0);
  local_208[0].sz.width = 0;
  local_208[0].sz.height = 0;
  local_208[0].flags = 0x1010000;
  local_250.sz.width = 0;
  local_250.sz.height = 0;
  local_250.flags = 0x2010000;
  local_250.obj = local_e8;
  local_208[0].obj = inputImg;
  cv::Sobel(local_208,(_OutputArray *)&local_250,0,0,1,3,1.0,0.0,4);
  local_208[0].sz.width = 0;
  local_208[0].sz.height = 0;
  local_208[0].flags = 0x1010000;
  local_250.sz.width = 0;
  local_250.sz.height = 0;
  local_250.flags = 0x2010000;
  local_250.obj = local_1a8;
  local_208[0].obj = local_e8;
  cv::convertScaleAbs(local_208,(_OutputArray *)&local_250,1.0,0.0);
  cv::Mat::Mat((Mat *)local_208);
  local_250.sz.width = 0;
  local_250.sz.height = 0;
  local_250.flags = 0x1010000;
  local_220.sz.width = 0;
  local_220.sz.height = 0;
  local_220.flags = 0x1010000;
  local_238.super__InputArray.sz.width = 0;
  local_238.super__InputArray.sz.height = 0;
  local_238.super__InputArray.flags = 0x2010000;
  local_250.obj = local_148;
  local_238.super__InputArray.obj = local_208;
  local_220.obj = local_1a8;
  p_Var3 = (_InputArray *)cv::noArray();
  cv::add(&local_250,&local_220,&local_238,p_Var3,-1);
  if ((long)(int)local_208[0].obj < 1) {
    fVar6 = 0.0;
  }
  else {
    fVar6 = 0.0;
    lVar4 = 0;
    do {
      if (0 < (int)local_208[0].obj._4_4_) {
        uVar5 = 0;
        fVar7 = fVar6;
        do {
          fVar6 = fVar7 + 1.0;
          if (0x13 < *(byte *)(*local_1c0 * lVar4 + (long)local_208[0].sz + uVar5)) {
            fVar6 = fVar7;
          }
          uVar5 = uVar5 + 1;
          fVar7 = fVar6;
        } while (local_208[0].obj._4_4_ != uVar5);
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 != (int)local_208[0].obj);
  }
  iVar1 = *(int *)(inputImg + 0xc);
  iVar2 = *(int *)(inputImg + 8);
  cv::Mat::~Mat((Mat *)local_208);
  cv::Mat::~Mat(local_1a8);
  cv::Mat::~Mat(local_148);
  cv::Mat::~Mat(local_e8);
  cv::Mat::~Mat(local_88);
  return (fVar6 / (float)(iVar1 * iVar2)) * 100.0;
}

Assistant:

float calculateEdginess(Mat inputImg) {
    float numOfBlurry = 0.0;
    float sum = 0;
    Mat grad_x, grad_y;
    Mat abs_grad_x, abs_grad_y;
    int kernelSize = 3, scale = 1, delta = 0;

    Sobel( inputImg, grad_x, CV_8U, 1, 0, kernelSize, scale, delta, BORDER_DEFAULT );
    convertScaleAbs( grad_x, abs_grad_x );

    Sobel( inputImg, grad_y, CV_8U, 0, 1, kernelSize, scale, delta, BORDER_DEFAULT );
    convertScaleAbs( grad_y, abs_grad_y );

    Mat grad;

    add(abs_grad_x, abs_grad_y, grad);

    for (int i = 0; i < grad.rows; i ++) {
        for (int j = 0; j < grad.cols; j++) {
            sum += (int)(grad.at<uchar>(i,j));
            if ( (int)(grad.at<uchar>(i,j))  < 20) {
                numOfBlurry++;
            }
        }
    }
    return ( numOfBlurry/ (inputImg.rows * inputImg.cols) ) * 100;
}